

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeUint32
          (BinaryReaderObjdumpDisassemble *this,uint32_t value)

{
  uint uVar1;
  bool bVar2;
  Enum EVar3;
  size_type sVar4;
  const_pointer pvVar5;
  string_view sVar6;
  byte local_49;
  size_t local_40;
  char *local_38;
  undefined1 local_30 [8];
  string_view name;
  uint32_t value_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  name._M_str._4_4_ = value;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    EVar3 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
    local_49 = 0;
    if (EVar3 == DataDrop) {
      sVar6 = anon_unknown_16::BinaryReaderObjdumpBase::GetSegmentName
                        (&this->super_BinaryReaderObjdumpBase,name._M_str._4_4_);
      local_40 = sVar6._M_len;
      local_30 = (undefined1  [8])local_40;
      local_38 = sVar6._M_str;
      name._M_len = (size_t)local_38;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      local_49 = bVar2 ^ 0xff;
    }
    uVar1 = name._M_str._4_4_;
    if ((local_49 & 1) == 0) {
      LogOpcode(this,"%u",(ulong)name._M_str._4_4_);
    }
    else {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      LogOpcode(this,"%d <%.*s>",(ulong)uVar1,sVar4 & 0xffffffff,pvVar5);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeUint32(uint32_t value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  std::string_view name;
  if (current_opcode == Opcode::DataDrop &&
      !(name = GetSegmentName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%u", value);
  }
  return Result::Ok;
}